

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<unary_op_tuple<trng::optimized_impl::uint128,_float>_> *
Catch::Generators::
makeGenerators<unary_op_tuple<trng::optimized_impl::uint128,float>,unary_op_tuple<trng::optimized_impl::uint128,float>,unary_op_tuple<trng::optimized_impl::uint128,float>>
          (unary_op_tuple<trng::optimized_impl::uint128,_float> *val,
          unary_op_tuple<trng::optimized_impl::uint128,_float> *moreGenerators,
          unary_op_tuple<trng::optimized_impl::uint128,_float> *moreGenerators_1)

{
  unary_op_tuple<trng::optimized_impl::uint128,_float> *in_RDX;
  Generators<unary_op_tuple<trng::optimized_impl::uint128,_float>_> *in_RDI;
  unary_op_tuple<trng::optimized_impl::uint128,_float> *in_stack_ffffffffffffffa8;
  Generators<unary_op_tuple<trng::optimized_impl::uint128,_float>_> *generator;
  
  generator = in_RDI;
  value<unary_op_tuple<trng::optimized_impl::uint128,float>>(in_RDX);
  makeGenerators<unary_op_tuple<trng::optimized_impl::uint128,float>,unary_op_tuple<trng::optimized_impl::uint128,float>,unary_op_tuple<trng::optimized_impl::uint128,float>>
            ((GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_float>_> *)generator,
             (unary_op_tuple<trng::optimized_impl::uint128,_float> *)in_RDI,
             in_stack_ffffffffffffffa8);
  GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_float>_>::~GeneratorWrapper
            ((GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_float>_> *)0x43699e);
  return in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }